

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O0

void __thiscall llvm::ReplacementItem::ReplacementItem(ReplacementItem *this,StringRef Literal)

{
  ReplacementItem *this_local;
  StringRef Literal_local;
  
  this->Type = Literal;
  (this->Spec).Data = Literal.Data;
  (this->Spec).Length = Literal.Length;
  this->Index = 0;
  this->Align = 0;
  this->Where = Right;
  this->Pad = '\0';
  StringRef::StringRef(&this->Options);
  return;
}

Assistant:

explicit ReplacementItem(StringRef Literal)
      : Type(ReplacementType::Literal), Spec(Literal) {}